

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0)

{
  bool bVar1;
  undefined1 local_12 [8];
  OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_0159efbd == '\0') && (R0 < 0x10000)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_12,2);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg1(OpCode op, RegSlot R0)
    {
        OpLayoutT_Reg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }